

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::JitAllocator::release(JitAllocator *this,void *rx)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  Impl *pIVar4;
  JitAllocatorPool *pJVar5;
  JitAllocatorBlock *this_00;
  size_t sVar6;
  JitAllocatorBlock *pJVar7;
  bool value;
  Error EVar8;
  uint32_t releasedAreaStart;
  ulong uVar9;
  void *mem;
  uint32_t releasedAreaEnd;
  pthread_mutex_t *__mutex;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_59;
  pthread_mutex_t *local_58;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *local_50;
  ProtectJitReadWriteScope scope;
  
  pIVar4 = this->_impl;
  if (pIVar4 == (Impl *)JitAllocatorImpl_none) {
    EVar8 = 5;
  }
  else if (rx == (void *)0x0) {
    EVar8 = 2;
  }
  else {
    __mutex = (pthread_mutex_t *)(pIVar4 + 1);
    pthread_mutex_lock(__mutex);
    scope._rxPtr = rx;
    this_00 = ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
              get<unsigned_char*,asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                        ((ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)&pIVar4[4].granularity,
                         (uchar **)&scope,&local_59);
    if (this_00 == (JitAllocatorBlock *)0x0) {
      EVar8 = 3;
    }
    else {
      pJVar5 = this_00->_pool;
      uVar9 = (ulong)((long)rx - (long)(this_00->_mapping).rx) >> (pJVar5->granularityLog2 & 0x3f);
      releasedAreaStart = (uint32_t)uVar9;
      local_58 = __mutex;
      local_50 = (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *)&pIVar4[4].granularity;
      sVar6 = Support::bitVectorIndexOf<unsigned_long>
                        (this_00->_stopBitVector,uVar9 & 0xffffffff,value);
      releasedAreaEnd = (int)sVar6 + 1;
      *(long *)(pIVar4 + 4) = *(long *)(pIVar4 + 4) + -1;
      JitAllocatorBlock::markReleasedArea(this_00,releasedAreaStart,releasedAreaEnd);
      if ((pIVar4->options & kFillUnusedMemory) != kNone) {
        mem = (void *)((ulong)(releasedAreaStart * pJVar5->granularity) +
                      (long)(this_00->_mapping).rw);
        uVar9 = (ulong)((releasedAreaEnd - releasedAreaStart) * (uint)pJVar5->granularity);
        scope._policy = kDefault;
        scope._rxPtr = mem;
        scope._size = uVar9;
        VirtMem::protectJitMemory(kReadWrite);
        JitAllocatorImpl_fillPattern(mem,pIVar4->fillPattern,uVar9);
        VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(&scope);
      }
      __mutex = local_58;
      EVar8 = 0;
      if ((this_00->_flags & 2) != 0) {
        if ((pJVar5->emptyBlockCount == '\0') && ((pIVar4->options & kImmediateRelease) == kNone)) {
          pJVar5->emptyBlockCount = '\x01';
        }
        else {
          pJVar5 = this_00->_pool;
          if (pJVar5->cursor == this_00) {
            pJVar7 = *(JitAllocatorBlock **)
                      &this_00->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
            if (pJVar7 == (JitAllocatorBlock *)0x0) {
              pJVar7 = *(JitAllocatorBlock **)&this_00->field_0x18;
            }
            pJVar5->cursor = pJVar7;
          }
          ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
          remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                    (local_50,(ZoneTreeNode *)this_00,
                     (Compare<(asmjit::v1_14::Support::SortOrder)0> *)&scope);
          pJVar7 = this_00;
          ZoneList<asmjit::v1_14::JitAllocatorBlock>::unlink(&pJVar5->blocks,(char *)this_00);
          uVar2 = this_00->_flags;
          pJVar5->blockCount = pJVar5->blockCount - 1;
          uVar3 = this_00->_areaSize;
          uVar9 = (ulong)(uVar2 & 8);
          plVar1 = (long *)((long)pJVar5->totalAreaSize + uVar9);
          *plVar1 = *plVar1 - (ulong)uVar3;
          plVar1 = (long *)((long)pJVar5->totalAreaUsed + uVar9);
          *plVar1 = *plVar1 - (ulong)this_00->_areaUsed;
          pJVar5->totalOverheadBytes =
               pJVar5->totalOverheadBytes - (ulong)((uVar3 + 0x3f >> 2 & 0xfffffff0) + 0x68);
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)this_00,pJVar7);
        }
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return EVar8;
}

Assistant:

Error JitAllocator::release(void* rx) noexcept {
  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!rx))
    return DebugUtils::errored(kErrorInvalidArgument);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  LockGuard guard(impl->lock);

  JitAllocatorBlock* block = impl->tree.get(static_cast<uint8_t*>(rx));
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidState);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)rx - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaIndex = uint32_t(offset >> pool->granularityLog2);
  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaIndex, true)) + 1;
  uint32_t areaSize = areaEnd - areaIndex;

  impl->allocationCount--;
  block->markReleasedArea(areaIndex, areaEnd);

  // Fill the released memory if the secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + areaIndex * pool->granularity;
    size_t spanSize = areaSize * pool->granularity;

    VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize);
    JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
  }

  // Release the whole block if it became empty.
  if (block->empty()) {
    if (pool->emptyBlockCount || Support::test(impl->options, JitAllocatorOptions::kImmediateRelease)) {
      JitAllocatorImpl_removeBlock(impl, block);
      JitAllocatorImpl_deleteBlock(impl, block);
    }
    else {
      pool->emptyBlockCount++;
    }
  }

  return kErrorOk;
}